

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

long xmlSaveTree(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  long ret;
  xmlNodePtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSaveCtxtPtr)0x0) || (cur == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSaveCtxtPtr)0xffffffffffffffff;
  }
  else if ((ctxt->options & 0x10U) == 0) {
    if (((((cur->type == XML_NAMESPACE_DECL) || (cur->doc == (_xmlDoc *)0x0)) ||
         (cur->doc->type != XML_HTML_DOCUMENT_NODE)) || ((ctxt->options & 0x20U) != 0)) &&
       ((ctxt->options & 0x40U) == 0)) {
      xmlNodeDumpOutputInternal(ctxt,cur);
      ctxt_local = (xmlSaveCtxtPtr)0x0;
    }
    else {
      htmlNodeDumpOutputInternal(ctxt,cur);
      ctxt_local = (xmlSaveCtxtPtr)0x0;
    }
  }
  else {
    xhtmlNodeDumpOutput(ctxt,cur);
    ctxt_local = (xmlSaveCtxtPtr)0x0;
  }
  return (long)ctxt_local;
}

Assistant:

long
xmlSaveTree(xmlSaveCtxtPtr ctxt, xmlNodePtr cur)
{
    long ret = 0;

    if ((ctxt == NULL) || (cur == NULL)) return(-1);
#ifdef LIBXML_HTML_ENABLED
    if (ctxt->options & XML_SAVE_XHTML) {
        xhtmlNodeDumpOutput(ctxt, cur);
        return(ret);
    }
    if (((cur->type != XML_NAMESPACE_DECL) && (cur->doc != NULL) &&
         (cur->doc->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
	htmlNodeDumpOutputInternal(ctxt, cur);
	return(ret);
    }
#endif
    xmlNodeDumpOutputInternal(ctxt, cur);
    return(ret);
}